

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

IDummyTransformationSceneNode * __thiscall
irr::scene::CSceneManager::addDummyTransformationSceneNode
          (CSceneManager *this,ISceneNode *parent,s32 id)

{
  IDummyTransformationSceneNode *mgr;
  ISceneNode *in_RDI;
  IDummyTransformationSceneNode *node;
  undefined4 in_stack_ffffffffffffffc8;
  s32 in_stack_ffffffffffffffcc;
  CDummyTransformationSceneNode *in_stack_ffffffffffffffe0;
  
  mgr = (IDummyTransformationSceneNode *)operator_new(0x150);
  CDummyTransformationSceneNode::CDummyTransformationSceneNode
            (in_stack_ffffffffffffffe0,in_RDI,(ISceneManager *)mgr,in_stack_ffffffffffffffcc);
  IReferenceCounted::drop
            ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return mgr;
}

Assistant:

IDummyTransformationSceneNode *CSceneManager::addDummyTransformationSceneNode(
		ISceneNode *parent, s32 id)
{
	if (!parent)
		parent = this;

	IDummyTransformationSceneNode *node = new CDummyTransformationSceneNode(
			parent, this, id);
	node->drop();

	return node;
}